

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# res0.c
# Opt level: O3

void res0_pack(vorbis_info_residue *vr,oggpack_buffer *opb)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  unsigned_long value;
  ulong uVar5;
  long lVar6;
  
  oggpack_write(opb,*vr,0x18);
  oggpack_write(opb,*(unsigned_long *)((long)vr + 8),0x18);
  oggpack_write(opb,(long)*(int *)((long)vr + 0x10) - 1,0x18);
  oggpack_write(opb,(long)*(int *)((long)vr + 0x14) - 1,6);
  oggpack_write(opb,(long)*(int *)((long)vr + 0x1c),8);
  if (0 < *(int *)((long)vr + 0x14)) {
    lVar6 = 0;
    uVar4 = 0;
    do {
      iVar2 = ov_ilog(*(ogg_uint32_t *)((long)vr + lVar6 * 4 + 0x20));
      value = (unsigned_long)*(int *)((long)vr + lVar6 * 4 + 0x20);
      if (iVar2 < 4) {
        iVar2 = 4;
      }
      else {
        oggpack_write(opb,value,3);
        oggpack_write(opb,1,1);
        value = (unsigned_long)(*(int *)((long)vr + lVar6 * 4 + 0x20) >> 3);
        iVar2 = 5;
      }
      oggpack_write(opb,value,iVar2);
      uVar3 = *(uint *)((long)vr + lVar6 * 4 + 0x20);
      iVar2 = 0;
      if (uVar3 != 0) {
        do {
          iVar2 = iVar2 + (uVar3 & 1);
          bVar1 = 1 < uVar3;
          uVar3 = uVar3 >> 1;
        } while (bVar1);
      }
      uVar4 = uVar4 + iVar2;
      lVar6 = lVar6 + 1;
    } while (lVar6 < *(int *)((long)vr + 0x14));
    if (0 < (int)uVar4) {
      uVar5 = 0;
      do {
        oggpack_write(opb,(long)*(int *)((long)vr + uVar5 * 4 + 0x120),8);
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
    }
  }
  return;
}

Assistant:

void res0_pack(vorbis_info_residue *vr,oggpack_buffer *opb){
  vorbis_info_residue0 *info=(vorbis_info_residue0 *)vr;
  int j,acc=0;
  oggpack_write(opb,info->begin,24);
  oggpack_write(opb,info->end,24);

  oggpack_write(opb,info->grouping-1,24);  /* residue vectors to group and
                                             code with a partitioned book */
  oggpack_write(opb,info->partitions-1,6); /* possible partition choices */
  oggpack_write(opb,info->groupbook,8);  /* group huffman book */

  /* secondstages is a bitmask; as encoding progresses pass by pass, a
     bitmask of one indicates this partition class has bits to write
     this pass */
  for(j=0;j<info->partitions;j++){
    if(ov_ilog(info->secondstages[j])>3){
      /* yes, this is a minor hack due to not thinking ahead */
      oggpack_write(opb,info->secondstages[j],3);
      oggpack_write(opb,1,1);
      oggpack_write(opb,info->secondstages[j]>>3,5);
    }else
      oggpack_write(opb,info->secondstages[j],4); /* trailing zero */
    acc+=icount(info->secondstages[j]);
  }
  for(j=0;j<acc;j++)
    oggpack_write(opb,info->booklist[j],8);

}